

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetBorderRoutersInNetwork
          (Registry *this,uint64_t aXpan,BorderRouterArray *aRet)

{
  Status SVar1;
  int iVar2;
  Network nwk;
  BorderRouter pred;
  
  Network::Network(&nwk);
  BorderRouter::BorderRouter(&pred);
  SVar1 = GetNetworkByXpan(this,aXpan,&nwk);
  if (SVar1 == kSuccess) {
    pred.mNetworkId = nwk.mId;
    iVar2 = (*this->mStorage->_vptr_PersistentStorage[0x17])(this->mStorage,&pred,aRet);
    SVar1 = kNotFound;
    if ((char)iVar2 != '\x01') {
      SVar1 = ((char)iVar2 != '\0') << 2;
    }
  }
  BorderRouter::~BorderRouter(&pred);
  Network::~Network(&nwk);
  return SVar1;
}

Assistant:

Registry::Status Registry::GetBorderRoutersInNetwork(uint64_t aXpan, BorderRouterArray &aRet)
{
    Network          nwk;
    BorderRouter     pred;
    Registry::Status status = GetNetworkByXpan(aXpan, nwk);

    VerifyOrExit(status == Registry::Status::kSuccess);
    pred.mNetworkId = nwk.mId;
    status          = MapStatus(mStorage->Lookup(pred, aRet));
exit:
    return status;
}